

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

ClassStmt * new_class_stmt(Token *name,List *extends,BlockStmt *block,Modifier *modifier)

{
  void *any;
  ClassStmt *pCVar1;
  TreeNode *pTVar2;
  ClassStmt *stmt;
  Modifier *modifier_local;
  BlockStmt *block_local;
  List *extends_local;
  Token *name_local;
  
  any = malloc(0x28);
  pCVar1 = (ClassStmt *)require_not_null(any,"Failed to allocate space");
  pTVar2 = new_tree_node(name,class_eval);
  (pCVar1->node).eval = pTVar2->eval;
  (pCVar1->node).token = pTVar2->token;
  pCVar1->extends = extends;
  pCVar1->block = block;
  pCVar1->modifier = modifier;
  return pCVar1;
}

Assistant:

ClassStmt *new_class_stmt(Token *name, List *extends, BlockStmt *block, Modifier* modifier) {
    ClassStmt *stmt = new(ClassStmt);
    stmt->node = tree_node_(name, eval_handler(class_eval));
    stmt->extends = extends;
    stmt->block = block;
    stmt->modifier = modifier;
    return stmt;
}